

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datumtest.cpp
# Opt level: O2

int testDatumFloat(void)

{
  float fVar1;
  VRCORETYPE_ID_conflict VVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  int iVar7;
  bool bVar8;
  float extraout_XMM0_Da;
  string local_250;
  VRDatumFloat a;
  string local_1c8 [32];
  ostringstream buf;
  
  iVar4 = 0;
  iVar7 = 10;
  while( true ) {
    bVar8 = iVar7 == 0;
    iVar7 = iVar7 + -1;
    if (bVar8) break;
    MinVR::VRDatumFloat::VRDatumFloat(&a,37.123);
    std::__cxx11::string::string
              ((string *)&buf,
               (string *)
               &a.super_VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>.super_VRDatum_conflict.
                description);
    iVar3 = std::__cxx11::string::compare((char *)&buf);
    std::__cxx11::string::~string((string *)&buf);
    (*a.super_VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>.super_VRDatum_conflict.
      _vptr_VRDatum[8])(&a);
    iVar4 = (*a.super_VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>.super_VRDatum_conflict.
              _vptr_VRDatum[9])(&a);
    VVar2 = a.super_VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>.super_VRDatum_conflict.type;
    fVar1 = *(float *)CONCAT44(extraout_var,iVar4);
    MinVR::VRDatumFloat::getValueString_abi_cxx11_((string *)&buf,&a);
    iVar5 = std::__cxx11::string::compare((char *)&buf);
    std::__cxx11::string::~string((string *)&buf);
    iVar6 = (*a.super_VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>.super_VRDatum_conflict.
              _vptr_VRDatum[6])(&a);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
    MinVR::operator<<((ostream *)&buf,(VRDatum_conflict *)&a);
    MinVR::VRDatumFloat::getValueString_abi_cxx11_(&local_250,&a);
    std::__cxx11::stringbuf::str();
    iVar4 = std::__cxx11::string::compare((string *)&local_250);
    iVar4 = (uint)(iVar6 != 0x25) + (uint)(VVar2 != VRCORETYPE_FLOAT) + iVar5 +
            iVar3 + (uint)(extraout_XMM0_Da != 37.123) + (uint)(fVar1 != 37.123) + iVar4;
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
    MinVR::VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>::~VRDatumSpecialized
              ((VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> *)&a);
  }
  return iVar4;
}

Assistant:

int testDatumFloat() {

  int out = 0;

  LOOP {
    MinVR::VRDatumFloat a = MinVR::VRDatumFloat(37.123f);

    out = a.getDescription().compare("float");

    float b = a.getValue();

    out += (37.123f == b) ? 0 : 1;

    const float* pb = a.getValue();
    out += (37.123f == (*pb)) ? 0 : 1;
    
    out += (a.getType() == MinVR::VRCORETYPE_FLOAT) ? 0 : 1;

    out += a.getValueString().compare("37.123001");

    int j = a.getValue();
    out += (j == 37) ? 0 : 1;

    std::ostringstream buf;
    buf << a;
    out += a.getValueString().compare(buf.str());

    // std::cout << "a:" << a << ",a.getValueString()=" << a.getValueString() << ",buf=" << buf.str() << ",j:" << j << ",out=" << out << std::endl;

  }